

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fMultisampleShaderRenderCase.cpp
# Opt level: O0

int __thiscall
deqp::gles31::Functional::MultisampleShaderRenderUtil::MultisampleRenderCase::init
          (MultisampleRenderCase *this,EVP_PKEY_CTX *ctx)

{
  RenderTarget RVar1;
  bool bVar2;
  int iVar3;
  deUint32 dVar4;
  int extraout_EAX;
  RenderContext *pRVar5;
  undefined4 extraout_var;
  mapped_type *this_00;
  NotSupportedError *pNVar6;
  TestError *pTVar7;
  TestLog *pTVar8;
  MessageBuilder *pMVar9;
  ShaderProgram *pSVar10;
  ProgramSources *pPVar11;
  RenderTarget *pRVar12;
  char *local_a10;
  allocator<char> local_9f1;
  string local_9f0;
  allocator<char> local_9c9;
  string local_9c8;
  allocator<char> local_9a1;
  string local_9a0;
  LogSection local_980;
  undefined1 local_939;
  string local_938;
  ShaderSource local_918;
  string local_8f0;
  ShaderSource local_8d0;
  ProgramSources local_8a8;
  int local_7d8;
  undefined1 local_7d2;
  allocator<char> local_7d1;
  int realSampleCount;
  undefined1 local_7aa;
  allocator<char> local_7a9;
  string local_7a8;
  MessageBuilder local_788;
  undefined1 local_602;
  allocator<char> local_601;
  string local_600;
  undefined1 local_5da;
  allocator<char> local_5d9;
  string local_5d8;
  allocator<char> local_5b1;
  string local_5b0;
  allocator<char> local_589;
  string local_588;
  LogSection local_568;
  undefined1 local_521;
  string local_520;
  ShaderSource local_500;
  allocator<char> local_4d1;
  string local_4d0;
  StringTemplate local_4b0;
  string local_490;
  ShaderSource local_470;
  ProgramSources local_448;
  undefined1 local_372;
  allocator<char> local_371;
  string local_370;
  MessageBuilder local_350;
  undefined1 local_1ca;
  allocator<char> local_1c9;
  string local_1c8;
  undefined4 local_1a8;
  undefined1 local_1a2;
  allocator<char> local_1a1;
  deUint32 textureTarget;
  int local_180;
  undefined1 local_17a;
  allocator<char> local_179;
  deInt32 maxRboSamples;
  int local_158;
  undefined1 local_151;
  deInt32 maxTextureSamples;
  string local_130;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  allocator<char> local_89;
  key_type local_88;
  undefined1 local_58 [8];
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  args;
  int local_1c;
  bool supportsES32;
  long lStack_18;
  deInt32 queriedSampleCount;
  Functions *gl;
  MultisampleRenderCase *this_local;
  
  gl = (Functions *)this;
  pRVar5 = gles31::Context::getRenderContext((this->super_TestCase).m_context);
  iVar3 = (*pRVar5->_vptr_RenderContext[3])();
  lStack_18 = CONCAT44(extraout_var,iVar3);
  local_1c = -1;
  pRVar5 = gles31::Context::getRenderContext((this->super_TestCase).m_context);
  args._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ = (*pRVar5->_vptr_RenderContext[2])();
  args._M_t._M_impl.super__Rb_tree_header._M_node_count._0_4_ = glu::ApiType::es(3,2);
  bVar2 = glu::contextSupports
                    ((ContextType)args._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_,
                     args._M_t._M_impl.super__Rb_tree_header._M_node_count._0_4_);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         *)local_58);
  if (bVar2) {
    local_a10 = glu::getGLSLVersionDeclaration(GLSL_VERSION_320_ES);
  }
  else {
    local_a10 = glu::getGLSLVersionDeclaration(GLSL_VERSION_310_ES);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_88,"GLSL_VERSION_DECL",&local_89);
  this_00 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)local_58,&local_88);
  std::__cxx11::string::operator=((string *)this_00,local_a10);
  std::__cxx11::string::~string((string *)&local_88);
  std::allocator<char>::~allocator(&local_89);
  RVar1 = this->m_renderTarget;
  if (RVar1 == TARGET_DEFAULT) {
    pRVar12 = gles31::Context::getRenderTarget((this->super_TestCase).m_context);
    iVar3 = tcu::RenderTarget::getWidth(pRVar12);
    if (this->m_renderSize <= iVar3) {
      pRVar12 = gles31::Context::getRenderTarget((this->super_TestCase).m_context);
      iVar3 = tcu::RenderTarget::getHeight(pRVar12);
      if (this->m_renderSize <= iVar3) goto LAB_0220bbf0;
    }
    local_151 = 1;
    pNVar6 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    de::toString<int>(&local_130,&this->m_renderSize);
    std::operator+(&local_110,"Test requires render target with size ",&local_130);
    std::operator+(&local_f0,&local_110,"x");
    de::toString<int>((string *)&maxTextureSamples,&this->m_renderSize);
    std::operator+(&local_d0,&local_f0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &maxTextureSamples);
    std::operator+(&local_b0,&local_d0," or greater");
    tcu::NotSupportedError::NotSupportedError(pNVar6,&local_b0);
    local_151 = 0;
    __cxa_throw(pNVar6,&tcu::NotSupportedError::typeinfo,tcu::NotSupportedError::~NotSupportedError)
    ;
  }
  if (RVar1 == TARGET_TEXTURE) {
    local_158 = 0;
    (**(code **)(lStack_18 + 0x880))(0x9100,0x8058,0x80a9,1,&local_158);
    if (local_158 < this->m_numRequestedSamples) {
      local_17a = 1;
      pNVar6 = (NotSupportedError *)__cxa_allocate_exception(0x38);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&maxRboSamples,"Sample count not supported",&local_179);
      tcu::NotSupportedError::NotSupportedError(pNVar6,(string *)&maxRboSamples);
      local_17a = 0;
      __cxa_throw(pNVar6,&tcu::NotSupportedError::typeinfo,
                  tcu::NotSupportedError::~NotSupportedError);
    }
  }
  else if (RVar1 == TARGET_RENDERBUFFER) {
    local_180 = 0;
    (**(code **)(lStack_18 + 0x880))(0x8d41,0x8058,0x80a9,1,&local_180);
    if (local_180 < this->m_numRequestedSamples) {
      local_1a2 = 1;
      pNVar6 = (NotSupportedError *)__cxa_allocate_exception(0x38);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&textureTarget,"Sample count not supported",&local_1a1);
      tcu::NotSupportedError::NotSupportedError(pNVar6,(string *)&textureTarget);
      local_1a2 = 0;
      __cxa_throw(pNVar6,&tcu::NotSupportedError::typeinfo,
                  tcu::NotSupportedError::~NotSupportedError);
    }
  }
LAB_0220bbf0:
  (**(code **)(lStack_18 + 0x6c8))(1,&this->m_buffer);
  dVar4 = (**(code **)(lStack_18 + 0x800))();
  glu::checkError(dVar4,"gen buf",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fMultisampleShaderRenderCase.cpp"
                  ,0x91);
  (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0xe])();
  dVar4 = (**(code **)(lStack_18 + 0x800))();
  glu::checkError(dVar4,"setup data",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fMultisampleShaderRenderCase.cpp"
                  ,0x94);
  (**(code **)(lStack_18 + 0x708))(1,&this->m_renderVao);
  dVar4 = (**(code **)(lStack_18 + 0x800))();
  glu::checkError(dVar4,"gen vao",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fMultisampleShaderRenderCase.cpp"
                  ,0x97);
  if ((init()::fullscreenQuad == '\0') &&
     (iVar3 = __cxa_guard_acquire(&init()::fullscreenQuad), iVar3 != 0)) {
    tcu::Vector<float,_4>::Vector(init::fullscreenQuad,1.0,-1.0,0.0,1.0);
    tcu::Vector<float,_4>::Vector(init::fullscreenQuad + 1,1.0,1.0,0.0,1.0);
    tcu::Vector<float,_4>::Vector(init::fullscreenQuad + 2,-1.0,-1.0,0.0,1.0);
    tcu::Vector<float,_4>::Vector(init::fullscreenQuad + 3,-1.0,1.0,0.0,1.0);
    __cxa_guard_release(&init()::fullscreenQuad);
  }
  (**(code **)(lStack_18 + 0x6c8))(1,&this->m_resolveBuffer);
  (**(code **)(lStack_18 + 0x40))(0x8892,this->m_resolveBuffer);
  (**(code **)(lStack_18 + 0x150))(0x8892,0x40,init::fullscreenQuad,0x88e4);
  dVar4 = (**(code **)(lStack_18 + 0x800))();
  glu::checkError(dVar4,"setup data",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fMultisampleShaderRenderCase.cpp"
                  ,0xa6);
  if (this->m_renderTarget == TARGET_TEXTURE) {
    local_1a8 = 0x9100;
    if (this->m_numRequestedSamples == 0) {
      local_1a8 = 0xde1;
    }
    (**(code **)(lStack_18 + 0x708))(1,&this->m_resolveVao);
    dVar4 = (**(code **)(lStack_18 + 0x800))();
    glu::checkError(dVar4,"gen vao",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fMultisampleShaderRenderCase.cpp"
                    ,0xb1);
    (**(code **)(lStack_18 + 0x6f8))(1,&this->m_fboTexture);
    (**(code **)(lStack_18 + 0xb8))(local_1a8,this->m_fboTexture);
    if (this->m_numRequestedSamples == 0) {
      (**(code **)(lStack_18 + 0x1380))(local_1a8,1,0x8058,this->m_renderSize);
      (**(code **)(lStack_18 + 0x1360))(local_1a8,0x2800,0x2600);
      (**(code **)(lStack_18 + 0x1360))(local_1a8,0x2801,0x2600);
    }
    else {
      (**(code **)(lStack_18 + 0x1390))
                (local_1a8,this->m_numRequestedSamples,0x8058,this->m_renderSize,this->m_renderSize,
                 0);
    }
    dVar4 = (**(code **)(lStack_18 + 0x800))();
    glu::checkError(dVar4,"gen tex",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fMultisampleShaderRenderCase.cpp"
                    ,0xbd);
    (**(code **)(lStack_18 + 0x6d0))(1,&this->m_fbo);
    (**(code **)(lStack_18 + 0x78))(0x8d40,this->m_fbo);
    (**(code **)(lStack_18 + 0x6a0))(0x8d40,0x8ce0,local_1a8,this->m_fboTexture,0);
    dVar4 = (**(code **)(lStack_18 + 0x800))();
    glu::checkError(dVar4,"gen fbo",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fMultisampleShaderRenderCase.cpp"
                    ,0xc2);
    iVar3 = (**(code **)(lStack_18 + 0x170))(0x8d40);
    if (iVar3 != 0x8cd5) {
      local_1ca = 1;
      pTVar7 = (TestError *)__cxa_allocate_exception(0x38);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1c8,"fbo not complete",&local_1c9);
      tcu::TestError::TestError(pTVar7,&local_1c8);
      local_1ca = 0;
      __cxa_throw(pTVar7,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
    }
    if (this->m_numRequestedSamples != 0) {
      (**(code **)(lStack_18 + 0xab0))(0x9100,0,0x9106,&local_1c);
      pTVar8 = tcu::TestContext::getLog
                         ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
      tcu::TestLog::operator<<(&local_350,pTVar8,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar9 = tcu::MessageBuilder::operator<<(&local_350,(char (*) [11])"Asked for ");
      pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,&this->m_numRequestedSamples);
      pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,(char (*) [15])" samples, got ");
      pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,&local_1c);
      pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,(char (*) [10])0x2bf1157);
      tcu::MessageBuilder::operator<<(pMVar9,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder(&local_350);
      if (local_1c < this->m_numRequestedSamples) {
        local_372 = 1;
        pTVar7 = (TestError *)__cxa_allocate_exception(0x38);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_370,"Got less texture samples than asked for",&local_371);
        tcu::TestError::TestError(pTVar7,&local_370);
        local_372 = 0;
        __cxa_throw(pTVar7,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
      }
    }
    pSVar10 = (ShaderProgram *)operator_new(0xd0);
    local_521 = 1;
    pRVar5 = gles31::Context::getRenderContext((this->super_TestCase).m_context);
    glu::ProgramSources::ProgramSources(&local_448);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_4d0,
               "${GLSL_VERSION_DECL}\nin highp vec4 a_position;\nout highp vec4 v_position;\nvoid main (void)\n{\n\tgl_Position = a_position;\n\tv_position = a_position;\n}"
               ,&local_4d1);
    tcu::StringTemplate::StringTemplate(&local_4b0,&local_4d0);
    tcu::StringTemplate::specialize
              (&local_490,&local_4b0,
               (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)local_58);
    glu::VertexSource::VertexSource((VertexSource *)&local_470,&local_490);
    pPVar11 = glu::ProgramSources::operator<<(&local_448,&local_470);
    genMSSamplerSource_abi_cxx11_(&local_520,this,local_1c);
    glu::FragmentSource::FragmentSource((FragmentSource *)&local_500,&local_520);
    pPVar11 = glu::ProgramSources::operator<<(pPVar11,&local_500);
    glu::ShaderProgram::ShaderProgram(pSVar10,pRVar5,pPVar11);
    local_521 = 0;
    this->m_textureSamplerProgram = pSVar10;
    glu::FragmentSource::~FragmentSource((FragmentSource *)&local_500);
    std::__cxx11::string::~string((string *)&local_520);
    glu::VertexSource::~VertexSource((VertexSource *)&local_470);
    std::__cxx11::string::~string((string *)&local_490);
    tcu::StringTemplate::~StringTemplate(&local_4b0);
    std::__cxx11::string::~string((string *)&local_4d0);
    std::allocator<char>::~allocator(&local_4d1);
    glu::ProgramSources::~ProgramSources(&local_448);
    bVar2 = glu::ShaderProgram::isOk(this->m_textureSamplerProgram);
    if (!bVar2) {
      pTVar8 = tcu::TestContext::getLog
                         ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_588,"SamplerShader",&local_589);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_5b0,"Sampler shader",&local_5b1);
      tcu::LogSection::LogSection(&local_568,&local_588,&local_5b0);
      pTVar8 = tcu::TestLog::operator<<(pTVar8,&local_568);
      pTVar8 = glu::operator<<(pTVar8,this->m_textureSamplerProgram);
      tcu::TestLog::operator<<(pTVar8,(EndSectionToken *)&tcu::TestLog::EndSection);
      tcu::LogSection::~LogSection(&local_568);
      std::__cxx11::string::~string((string *)&local_5b0);
      std::allocator<char>::~allocator(&local_5b1);
      std::__cxx11::string::~string((string *)&local_588);
      std::allocator<char>::~allocator(&local_589);
      local_5da = 1;
      pTVar7 = (TestError *)__cxa_allocate_exception(0x38);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_5d8,"could not build program",&local_5d9);
      tcu::TestError::TestError(pTVar7,&local_5d8);
      local_5da = 0;
      __cxa_throw(pTVar7,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
    }
  }
  else if (this->m_renderTarget == TARGET_RENDERBUFFER) {
    (**(code **)(lStack_18 + 0x6e8))(1,&this->m_fboRbo);
    (**(code **)(lStack_18 + 0xa0))(0x8d41,this->m_fboRbo);
    (**(code **)(lStack_18 + 0x1240))(0x8d41,this->m_numRequestedSamples,0x8058,this->m_renderSize);
    dVar4 = (**(code **)(lStack_18 + 0x800))();
    glu::checkError(dVar4,"gen rbo",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fMultisampleShaderRenderCase.cpp"
                    ,0xe3);
    (**(code **)(lStack_18 + 0x6d0))(1,&this->m_fbo);
    (**(code **)(lStack_18 + 0x78))(0x8d40,this->m_fbo);
    (**(code **)(lStack_18 + 0x688))(0x8d40,0x8ce0,0x8d41,this->m_fboRbo);
    dVar4 = (**(code **)(lStack_18 + 0x800))();
    glu::checkError(dVar4,"gen fbo",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fMultisampleShaderRenderCase.cpp"
                    ,0xe8);
    iVar3 = (**(code **)(lStack_18 + 0x170))(0x8d40);
    if (iVar3 != 0x8cd5) {
      local_602 = 1;
      pTVar7 = (TestError *)__cxa_allocate_exception(0x38);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_600,"fbo not complete",&local_601);
      tcu::TestError::TestError(pTVar7,&local_600);
      local_602 = 0;
      __cxa_throw(pTVar7,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
    }
    (**(code **)(lStack_18 + 0xa30))(0x8d41,0x8cab,&local_1c);
    pTVar8 = tcu::TestContext::getLog
                       ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
    tcu::TestLog::operator<<(&local_788,pTVar8,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar9 = tcu::MessageBuilder::operator<<(&local_788,(char (*) [11])"Asked for ");
    pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,&this->m_numRequestedSamples);
    pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,(char (*) [15])" samples, got ");
    pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,&local_1c);
    pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,(char (*) [10])0x2bf1157);
    tcu::MessageBuilder::operator<<(pMVar9,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_788);
    if (local_1c < this->m_numRequestedSamples) {
      local_7aa = 1;
      pTVar7 = (TestError *)__cxa_allocate_exception(0x38);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_7a8,"Got less renderbuffer samples samples than asked for",
                 &local_7a9);
      tcu::TestError::TestError(pTVar7,&local_7a8);
      local_7aa = 0;
      __cxa_throw(pTVar7,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
    }
  }
  if (this->m_renderTarget != TARGET_DEFAULT) {
    (**(code **)(lStack_18 + 0x6f8))(1,&this->m_resolveFboTexture);
    (**(code **)(lStack_18 + 0xb8))(0xde1,this->m_resolveFboTexture);
    (**(code **)(lStack_18 + 0x1380))(0xde1,1,0x8058,this->m_renderSize);
    (**(code **)(lStack_18 + 0x1360))(0xde1,0x2800,0x2600);
    (**(code **)(lStack_18 + 0x1360))(0xde1,0x2801,0x2600);
    dVar4 = (**(code **)(lStack_18 + 0x800))();
    glu::checkError(dVar4,"gen tex",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fMultisampleShaderRenderCase.cpp"
                    ,0xfe);
    (**(code **)(lStack_18 + 0x6d0))(1,&this->m_resolveFbo);
    (**(code **)(lStack_18 + 0x78))(0x8d40,this->m_resolveFbo);
    (**(code **)(lStack_18 + 0x6a0))(0x8d40,0x8ce0,0xde1,this->m_resolveFboTexture,0);
    dVar4 = (**(code **)(lStack_18 + 0x800))();
    glu::checkError(dVar4,"gen fbo",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fMultisampleShaderRenderCase.cpp"
                    ,0x103);
    iVar3 = (**(code **)(lStack_18 + 0x170))(0x8d40);
    if (iVar3 != 0x8cd5) {
      local_7d2 = 1;
      pTVar7 = (TestError *)__cxa_allocate_exception(0x38);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&realSampleCount,"resolve fbo not complete",&local_7d1);
      tcu::TestError::TestError(pTVar7,(string *)&realSampleCount);
      local_7d2 = 0;
      __cxa_throw(pTVar7,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
    }
  }
  local_7d8 = -1;
  if (this->m_renderTarget == TARGET_TEXTURE) {
    if (this->m_numRequestedSamples == 0) {
      local_7d8 = 1;
    }
    else {
      local_7d8 = de::max<int>(1,local_1c);
    }
  }
  else if (this->m_renderTarget == TARGET_RENDERBUFFER) {
    local_7d8 = de::max<int>(1,local_1c);
  }
  else if (this->m_renderTarget == TARGET_DEFAULT) {
    pRVar12 = gles31::Context::getRenderTarget((this->super_TestCase).m_context);
    iVar3 = tcu::RenderTarget::getNumSamples(pRVar12);
    local_7d8 = de::max<int>(1,iVar3);
  }
  this->m_numTargetSamples = local_7d8;
  if ((this->m_perIterationShader & 1U) == 0) {
    pSVar10 = (ShaderProgram *)operator_new(0xd0);
    local_939 = 1;
    pRVar5 = gles31::Context::getRenderContext((this->super_TestCase).m_context);
    glu::ProgramSources::ProgramSources(&local_8a8);
    (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[10])
              (&local_8f0,this,(ulong)(uint)this->m_numTargetSamples);
    glu::VertexSource::VertexSource((VertexSource *)&local_8d0,&local_8f0);
    pPVar11 = glu::ProgramSources::operator<<(&local_8a8,&local_8d0);
    (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0xb])
              (&local_938,this,(ulong)(uint)this->m_numTargetSamples);
    glu::FragmentSource::FragmentSource((FragmentSource *)&local_918,&local_938);
    pPVar11 = glu::ProgramSources::operator<<(pPVar11,&local_918);
    glu::ShaderProgram::ShaderProgram(pSVar10,pRVar5,pPVar11);
    local_939 = 0;
    this->m_program = pSVar10;
    glu::FragmentSource::~FragmentSource((FragmentSource *)&local_918);
    std::__cxx11::string::~string((string *)&local_938);
    glu::VertexSource::~VertexSource((VertexSource *)&local_8d0);
    std::__cxx11::string::~string((string *)&local_8f0);
    glu::ProgramSources::~ProgramSources(&local_8a8);
    pTVar8 = tcu::TestContext::getLog
                       ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_9a0,"RenderShader",&local_9a1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_9c8,"Render shader",&local_9c9);
    tcu::LogSection::LogSection(&local_980,&local_9a0,&local_9c8);
    pTVar8 = tcu::TestLog::operator<<(pTVar8,&local_980);
    pTVar8 = glu::operator<<(pTVar8,this->m_program);
    tcu::TestLog::operator<<(pTVar8,(EndSectionToken *)&tcu::TestLog::EndSection);
    tcu::LogSection::~LogSection(&local_980);
    std::__cxx11::string::~string((string *)&local_9c8);
    std::allocator<char>::~allocator(&local_9c9);
    std::__cxx11::string::~string((string *)&local_9a0);
    std::allocator<char>::~allocator(&local_9a1);
    bVar2 = glu::ShaderProgram::isOk(this->m_program);
    if (!bVar2) {
      pTVar7 = (TestError *)__cxa_allocate_exception(0x38);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_9f0,"could not build program",&local_9f1);
      tcu::TestError::TestError(pTVar7,&local_9f0);
      __cxa_throw(pTVar7,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
    }
  }
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *)local_58);
  return extraout_EAX;
}

Assistant:

void MultisampleRenderCase::init (void)
{
	const glw::Functions&	gl					= m_context.getRenderContext().getFunctions();
	deInt32					queriedSampleCount	= -1;
	const bool				supportsES32		= glu::contextSupports(m_context.getRenderContext().getType(), glu::ApiType::es(3, 2));
	map<string, string>		args;

	args["GLSL_VERSION_DECL"] = supportsES32 ? getGLSLVersionDeclaration(glu::GLSL_VERSION_320_ES) : getGLSLVersionDeclaration(glu::GLSL_VERSION_310_ES);

	// requirements

	switch (m_renderTarget)
	{
		case TARGET_DEFAULT:
		{
			if (m_context.getRenderTarget().getWidth() < m_renderSize || m_context.getRenderTarget().getHeight() < m_renderSize)
				throw tcu::NotSupportedError("Test requires render target with size " + de::toString(m_renderSize) + "x" + de::toString(m_renderSize) + " or greater");
			break;
		}

		case TARGET_TEXTURE:
		{
			deInt32 maxTextureSamples = 0;
			gl.getInternalformativ(GL_TEXTURE_2D_MULTISAMPLE, GL_RGBA8, GL_SAMPLES, 1, &maxTextureSamples);

			if (m_numRequestedSamples > maxTextureSamples)
				throw tcu::NotSupportedError("Sample count not supported");
			break;
		}

		case TARGET_RENDERBUFFER:
		{
			deInt32 maxRboSamples = 0;
			gl.getInternalformativ(GL_RENDERBUFFER, GL_RGBA8, GL_SAMPLES, 1, &maxRboSamples);

			if (m_numRequestedSamples > maxRboSamples)
				throw tcu::NotSupportedError("Sample count not supported");
			break;
		}

		default:
			DE_ASSERT(false);
	}

	// resources

	{
		gl.genBuffers(1, &m_buffer);
		GLU_EXPECT_NO_ERROR(gl.getError(), "gen buf");

		setupRenderData();
		GLU_EXPECT_NO_ERROR(gl.getError(), "setup data");

		gl.genVertexArrays(1, &m_renderVao);
		GLU_EXPECT_NO_ERROR(gl.getError(), "gen vao");

		// buffer for MSAA texture resolving
		{
			static const tcu::Vec4 fullscreenQuad[] =
			{
				tcu::Vec4( 1.0f, -1.0f, 0.0f, 1.0f),
				tcu::Vec4( 1.0f,  1.0f, 0.0f, 1.0f),
				tcu::Vec4(-1.0f, -1.0f, 0.0f, 1.0f),
				tcu::Vec4(-1.0f,  1.0f, 0.0f, 1.0f),
			};

			gl.genBuffers(1, &m_resolveBuffer);
			gl.bindBuffer(GL_ARRAY_BUFFER, m_resolveBuffer);
			gl.bufferData(GL_ARRAY_BUFFER, (int)sizeof(fullscreenQuad), fullscreenQuad, GL_STATIC_DRAW);
			GLU_EXPECT_NO_ERROR(gl.getError(), "setup data");
		}
	}

	// msaa targets

	if (m_renderTarget == TARGET_TEXTURE)
	{
		const deUint32 textureTarget = (m_numRequestedSamples == 0) ? (GL_TEXTURE_2D) : (GL_TEXTURE_2D_MULTISAMPLE);

		gl.genVertexArrays(1, &m_resolveVao);
		GLU_EXPECT_NO_ERROR(gl.getError(), "gen vao");

		gl.genTextures(1, &m_fboTexture);
		gl.bindTexture(textureTarget, m_fboTexture);
		if (m_numRequestedSamples == 0)
		{
			gl.texStorage2D(textureTarget, 1, GL_RGBA8, m_renderSize, m_renderSize);
			gl.texParameteri(textureTarget, GL_TEXTURE_MAG_FILTER, GL_NEAREST);
			gl.texParameteri(textureTarget, GL_TEXTURE_MIN_FILTER, GL_NEAREST);
		}
		else
			gl.texStorage2DMultisample(textureTarget, m_numRequestedSamples, GL_RGBA8, m_renderSize, m_renderSize, GL_FALSE);
		GLU_EXPECT_NO_ERROR(gl.getError(), "gen tex");

		gl.genFramebuffers(1, &m_fbo);
		gl.bindFramebuffer(GL_FRAMEBUFFER, m_fbo);
		gl.framebufferTexture2D(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, textureTarget, m_fboTexture, 0);
		GLU_EXPECT_NO_ERROR(gl.getError(), "gen fbo");

		if (gl.checkFramebufferStatus(GL_FRAMEBUFFER) != GL_FRAMEBUFFER_COMPLETE)
			throw tcu::TestError("fbo not complete");

		if (m_numRequestedSamples != 0)
		{
			// for shader
			gl.getTexLevelParameteriv(GL_TEXTURE_2D_MULTISAMPLE, 0, GL_TEXTURE_SAMPLES, &queriedSampleCount);

			// logging
			m_testCtx.getLog() << tcu::TestLog::Message << "Asked for " << m_numRequestedSamples << " samples, got " << queriedSampleCount << " samples." << tcu::TestLog::EndMessage;

			// sanity
			if (queriedSampleCount < m_numRequestedSamples)
				throw tcu::TestError("Got less texture samples than asked for");
		}

		// texture sampler shader
		m_textureSamplerProgram = new glu::ShaderProgram(m_context.getRenderContext(), glu::ProgramSources()
			<< glu::VertexSource(tcu::StringTemplate(s_vertexSource).specialize(args))
			<< glu::FragmentSource(genMSSamplerSource(queriedSampleCount)));
		if (!m_textureSamplerProgram->isOk())
		{
			m_testCtx.getLog() << tcu::TestLog::Section("SamplerShader", "Sampler shader") << *m_textureSamplerProgram << tcu::TestLog::EndSection;
			throw tcu::TestError("could not build program");
		}
	}
	else if (m_renderTarget == TARGET_RENDERBUFFER)
	{
		gl.genRenderbuffers(1, &m_fboRbo);
		gl.bindRenderbuffer(GL_RENDERBUFFER, m_fboRbo);
		gl.renderbufferStorageMultisample(GL_RENDERBUFFER, m_numRequestedSamples, GL_RGBA8, m_renderSize, m_renderSize);
		GLU_EXPECT_NO_ERROR(gl.getError(), "gen rbo");

		gl.genFramebuffers(1, &m_fbo);
		gl.bindFramebuffer(GL_FRAMEBUFFER, m_fbo);
		gl.framebufferRenderbuffer(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, GL_RENDERBUFFER, m_fboRbo);
		GLU_EXPECT_NO_ERROR(gl.getError(), "gen fbo");

		if (gl.checkFramebufferStatus(GL_FRAMEBUFFER) != GL_FRAMEBUFFER_COMPLETE)
			throw tcu::TestError("fbo not complete");

		// logging
		gl.getRenderbufferParameteriv(GL_RENDERBUFFER, GL_RENDERBUFFER_SAMPLES, &queriedSampleCount);
		m_testCtx.getLog() << tcu::TestLog::Message << "Asked for " << m_numRequestedSamples << " samples, got " << queriedSampleCount << " samples." << tcu::TestLog::EndMessage;

		// sanity
		if (queriedSampleCount < m_numRequestedSamples)
			throw tcu::TestError("Got less renderbuffer samples samples than asked for");
	}

	// fbo for resolving the multisample fbo
	if (m_renderTarget != TARGET_DEFAULT)
	{
		gl.genTextures(1, &m_resolveFboTexture);
		gl.bindTexture(GL_TEXTURE_2D, m_resolveFboTexture);
		gl.texStorage2D(GL_TEXTURE_2D, 1, GL_RGBA8, m_renderSize, m_renderSize);
		gl.texParameteri(GL_TEXTURE_2D, GL_TEXTURE_MAG_FILTER, GL_NEAREST);
		gl.texParameteri(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER, GL_NEAREST);
		GLU_EXPECT_NO_ERROR(gl.getError(), "gen tex");

		gl.genFramebuffers(1, &m_resolveFbo);
		gl.bindFramebuffer(GL_FRAMEBUFFER, m_resolveFbo);
		gl.framebufferTexture2D(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, GL_TEXTURE_2D, m_resolveFboTexture, 0);
		GLU_EXPECT_NO_ERROR(gl.getError(), "gen fbo");

		if (gl.checkFramebufferStatus(GL_FRAMEBUFFER) != GL_FRAMEBUFFER_COMPLETE)
			throw tcu::TestError("resolve fbo not complete");
	}

	// create verifier shader and set targetSampleCount

	{
		int realSampleCount = -1;

		if (m_renderTarget == TARGET_TEXTURE)
		{
			if (m_numRequestedSamples == 0)
				realSampleCount = 1; // non msaa texture
			else
				realSampleCount = de::max(1, queriedSampleCount); // msaa texture
		}
		else if (m_renderTarget == TARGET_RENDERBUFFER)
		{
			realSampleCount = de::max(1, queriedSampleCount); // msaa rbo
		}
		else if (m_renderTarget == TARGET_DEFAULT)
		{
			realSampleCount = de::max(1, m_context.getRenderTarget().getNumSamples());
		}
		else
			DE_ASSERT(DE_FALSE);

		// is set and is valid
		DE_ASSERT(realSampleCount != -1);
		DE_ASSERT(realSampleCount != 0);
		m_numTargetSamples = realSampleCount;
	}

	if (!m_perIterationShader)
	{
		m_program = new glu::ShaderProgram(m_context.getRenderContext(), glu::ProgramSources() << glu::VertexSource(genVertexSource(m_numTargetSamples)) << glu::FragmentSource(genFragmentSource(m_numTargetSamples)));
		m_testCtx.getLog() << tcu::TestLog::Section("RenderShader", "Render shader") << *m_program << tcu::TestLog::EndSection;
		if (!m_program->isOk())
			throw tcu::TestError("could not build program");

	}
}